

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fonts.cpp
# Opt level: O0

ImFont * fonts::font_combined(float size_px)

{
  ImGuiIO *pIVar1;
  ImFont *pIVar2;
  ImGuiIO *io;
  ImFontConfig config;
  float size_px_local;
  
  config.DstFont._4_4_ = size_px;
  ImFontConfig::ImFontConfig((ImFontConfig *)&io);
  pIVar1 = ImGui::GetIO();
  ImFontAtlas::AddFontFromMemoryCompressedTTF
            (pIVar1->Fonts,&cousine_regular_compressed_data,0x92fe,config.DstFont._4_4_,
             (ImFontConfig *)&io,font_combined::cousine_ranges);
  config.GlyphMinAdvanceX._0_1_ = 1;
  config.OversampleH._0_1_ = 1;
  pIVar2 = ImFontAtlas::AddFontFromMemoryCompressedTTF
                     (pIVar1->Fonts,fontawesome_regular_compressed_data,0x571f,config.DstFont._4_4_,
                      (ImFontConfig *)&io,font_combined::fontawesome_ranges);
  return pIVar2;
}

Assistant:

ImFont * font_combined( float size_px )
{
    static const ImWchar cousine_ranges[]     = { 0x0020, 0x00FF, 0x0100, 0x017F, 0 };
    static const ImWchar fontawesome_ranges[] = { 0xf000, 0xf976, 0 };

    ImFontConfig config;

    ImGuiIO & io = ImGui::GetIO();
    io.Fonts->AddFontFromMemoryCompressedTTF(
        cousine_regular_compressed_data, cousine_regular_compressed_size, size_px, &config, cousine_ranges );
    config.MergeMode  = true;
    config.PixelSnapH = true;
    return io.Fonts->AddFontFromMemoryCompressedTTF(
        fontawesome_regular_compressed_data, fontawesome_regular_compressed_size, size_px, &config,
        fontawesome_ranges );
}